

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::_::
concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
          (String *__return_storage_ptr__,_ *this,ArrayPtr<const_char> *params,
          CappedArray<char,_26UL> *params_1,ArrayPtr<const_char> *params_2,
          CappedArray<char,_14UL> *params_3,ArrayPtr<const_char> *params_4)

{
  long lVar1;
  size_t size;
  char *target;
  long local_58;
  char *local_50;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  
  local_58 = *(long *)(this + 8);
  local_50 = params->ptr;
  local_48 = *(undefined8 *)params_1->content;
  local_40 = params_2->ptr;
  local_38 = *(undefined8 *)params_3->content;
  size = 0;
  lVar1 = 0;
  do {
    size = size + *(long *)((long)&local_58 + lVar1);
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x28);
  heapString(__return_storage_ptr__,size);
  target = (char *)(__return_storage_ptr__->content).size_;
  if (target != (char *)0x0) {
    target = (__return_storage_ptr__->content).ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (target,(ArrayPtr<const_char> *)this,(CappedArray<char,_26UL> *)params,
             (ArrayPtr<const_char> *)params_1,(CappedArray<char,_14UL> *)params_2,
             (ArrayPtr<const_char> *)params_3);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}